

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall CAnonFuncSymtabPrep::finish(CAnonFuncSymtabPrep *this)

{
  CTcPrsSymtab *this_00;
  
  for (this_00 = G_prs->local_symtab_;
      (this_00 != (CTcPrsSymtab *)0x0 && (this_00 != G_prs->global_symtab_));
      this_00 = this_00->parent_) {
    CTcPrsSymtab::enum_entries(this_00,enum_for_anon2,this);
  }
  return;
}

Assistant:

void finish()
    {
        /*
         *   Enumerate all of the entries in our scope once again - this
         *   time, we want to determine if there are any variables that were
         *   not previously referenced from anonymous functions but have been
         *   now; we need to convert all such variables to context locals.  
         */
        for (CTcPrsSymtab *tab = G_prs->get_local_symtab() ;
             tab != 0 && tab != G_prs->get_global_symtab() ;
             tab = tab->get_parent())
        {
            /* enumerate entries in this table */
            tab->enum_entries(&enum_for_anon2, this);
        }
    }